

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O1

void __thiscall
google::protobuf::DescriptorBuilder::CrossLinkMessage
          (DescriptorBuilder *this,Descriptor *message,DescriptorProto *proto)

{
  long lVar1;
  MessageOptions *pMVar2;
  LogMessage *pLVar3;
  long lVar4;
  long lVar5;
  LogFinisher local_121;
  DescriptorBuilder *local_120;
  Descriptor *local_118;
  LogMessage local_110;
  LogMessage local_d8;
  LogMessage local_a0;
  LogMessage local_68;
  
  local_120 = this;
  if (*(long *)(message + 0x20) == 0) {
    pMVar2 = MessageOptions::default_instance();
    *(MessageOptions **)(message + 0x20) = pMVar2;
  }
  if (0 < *(int *)(message + 0x38)) {
    lVar4 = 0;
    lVar5 = 0;
    local_118 = message;
    do {
      lVar1 = *(long *)(message + 0x40);
      if ((proto->nested_type_).super_RepeatedPtrFieldBase.current_size_ <= lVar5) {
        internal::LogMessage::LogMessage
                  (&local_68,LOGLEVEL_DFATAL,
                   "/workspace/llm4binary/github/license_all_cmakelists_1510/chai2010[P]protorpc/./src/google/protobuf/repeated_field.h"
                   ,0x338);
        pLVar3 = internal::LogMessage::operator<<(&local_68,"CHECK failed: (index) < (size()): ");
        internal::LogFinisher::operator=((LogFinisher *)&local_110,pLVar3);
        internal::LogMessage::~LogMessage(&local_68);
        message = local_118;
      }
      this = local_120;
      CrossLinkMessage(local_120,(Descriptor *)(lVar1 + lVar4),
                       (DescriptorProto *)
                       (proto->nested_type_).super_RepeatedPtrFieldBase.elements_[lVar5]);
      lVar5 = lVar5 + 1;
      lVar4 = lVar4 + 0x78;
    } while (lVar5 < *(int *)(message + 0x38));
  }
  if (0 < *(int *)(message + 0x48)) {
    lVar4 = 0;
    lVar5 = 0;
    do {
      lVar1 = *(long *)(message + 0x50);
      if ((proto->enum_type_).super_RepeatedPtrFieldBase.current_size_ <= lVar5) {
        internal::LogMessage::LogMessage
                  (&local_d8,LOGLEVEL_DFATAL,
                   "/workspace/llm4binary/github/license_all_cmakelists_1510/chai2010[P]protorpc/./src/google/protobuf/repeated_field.h"
                   ,0x338);
        pLVar3 = internal::LogMessage::operator<<(&local_d8,"CHECK failed: (index) < (size()): ");
        internal::LogFinisher::operator=((LogFinisher *)&local_110,pLVar3);
        this = (DescriptorBuilder *)&local_d8;
        internal::LogMessage::~LogMessage((LogMessage *)this);
      }
      CrossLinkEnum(this,(EnumDescriptor *)(lVar1 + lVar4),
                    (EnumDescriptorProto *)
                    (proto->enum_type_).super_RepeatedPtrFieldBase.elements_[lVar5]);
      lVar5 = lVar5 + 1;
      lVar4 = lVar4 + 0x38;
    } while (lVar5 < *(int *)(message + 0x48));
  }
  if (0 < *(int *)(message + 0x2c)) {
    lVar4 = 0;
    lVar5 = 0;
    do {
      lVar1 = *(long *)(message + 0x30);
      if ((proto->field_).super_RepeatedPtrFieldBase.current_size_ <= lVar5) {
        internal::LogMessage::LogMessage
                  (&local_a0,LOGLEVEL_DFATAL,
                   "/workspace/llm4binary/github/license_all_cmakelists_1510/chai2010[P]protorpc/./src/google/protobuf/repeated_field.h"
                   ,0x338);
        pLVar3 = internal::LogMessage::operator<<(&local_a0,"CHECK failed: (index) < (size()): ");
        internal::LogFinisher::operator=((LogFinisher *)&local_110,pLVar3);
        internal::LogMessage::~LogMessage(&local_a0);
      }
      CrossLinkField(local_120,(FieldDescriptor *)(lVar1 + lVar4),
                     (FieldDescriptorProto *)
                     (proto->field_).super_RepeatedPtrFieldBase.elements_[lVar5]);
      lVar5 = lVar5 + 1;
      lVar4 = lVar4 + 0x78;
    } while (lVar5 < *(int *)(message + 0x2c));
  }
  if (0 < *(int *)(message + 0x68)) {
    lVar4 = 0;
    lVar5 = 0;
    do {
      lVar1 = *(long *)(message + 0x70);
      if ((proto->extension_).super_RepeatedPtrFieldBase.current_size_ <= lVar5) {
        internal::LogMessage::LogMessage
                  (&local_110,LOGLEVEL_DFATAL,
                   "/workspace/llm4binary/github/license_all_cmakelists_1510/chai2010[P]protorpc/./src/google/protobuf/repeated_field.h"
                   ,0x338);
        pLVar3 = internal::LogMessage::operator<<(&local_110,"CHECK failed: (index) < (size()): ");
        internal::LogFinisher::operator=(&local_121,pLVar3);
        internal::LogMessage::~LogMessage(&local_110);
      }
      CrossLinkField(local_120,(FieldDescriptor *)(lVar1 + lVar4),
                     (FieldDescriptorProto *)
                     (proto->extension_).super_RepeatedPtrFieldBase.elements_[lVar5]);
      lVar5 = lVar5 + 1;
      lVar4 = lVar4 + 0x78;
    } while (lVar5 < *(int *)(message + 0x68));
  }
  return;
}

Assistant:

void DescriptorBuilder::CrossLinkMessage(
    Descriptor* message, const DescriptorProto& proto) {
  if (message->options_ == NULL) {
    message->options_ = &MessageOptions::default_instance();
  }

  for (int i = 0; i < message->nested_type_count(); i++) {
    CrossLinkMessage(&message->nested_types_[i], proto.nested_type(i));
  }

  for (int i = 0; i < message->enum_type_count(); i++) {
    CrossLinkEnum(&message->enum_types_[i], proto.enum_type(i));
  }

  for (int i = 0; i < message->field_count(); i++) {
    CrossLinkField(&message->fields_[i], proto.field(i));
  }

  for (int i = 0; i < message->extension_count(); i++) {
    CrossLinkField(&message->extensions_[i], proto.extension(i));
  }
}